

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::Pass::GenerateCopy
          (Pass *this,Instruction *object_to_copy,uint32_t new_type_id,
          Instruction *insertion_position)

{
  Op OVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  ConstantManager *pCVar6;
  DefUseManager *pDVar7;
  Instruction *pIVar8;
  Instruction *this_00;
  Constant *pCVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Instruction *object_to_copy_00;
  uint32_t i_1;
  uint index;
  uint32_t i;
  uint32_t uVar10;
  uint32_t local_c0;
  uint32_t local_bc;
  Instruction *local_b8;
  Instruction *local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> element_ids;
  uint32_t new_id;
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined8 local_68;
  ConstantManager *local_58;
  InstructionBuilder ir_builder;
  
  pCVar6 = IRContext::get_constant_mgr(this->context_);
  uVar2 = Instruction::type_id(object_to_copy);
  if (uVar2 == new_type_id) {
    uVar2 = Instruction::result_id(object_to_copy);
    return uVar2;
  }
  local_58 = pCVar6;
  InstructionBuilder::InstructionBuilder
            (&ir_builder,this->context_,insertion_position,
             kAnalysisInstrToBlockMapping|kAnalysisBegin);
  pDVar7 = get_def_use_mgr(this);
  pIVar8 = analysis::DefUseManager::GetDef(pDVar7,uVar2);
  pDVar7 = get_def_use_mgr(this);
  this_00 = analysis::DefUseManager::GetDef(pDVar7,new_type_id);
  OVar1 = this_00->opcode_;
  if (OVar1 != pIVar8->opcode_) {
    return 0;
  }
  local_b8 = object_to_copy;
  local_b0 = insertion_position;
  if (OVar1 == OpTypeStruct) {
    element_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    element_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    element_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_bc = new_type_id;
    for (index = 0; uVar2 = Instruction::NumInOperands(pIVar8), new_type_id = local_bc,
        index < uVar2; index = index + 1) {
      uVar2 = Instruction::GetSingleWordInOperand(pIVar8,index);
      uVar3 = Instruction::GetSingleWordInOperand(this_00,index);
      uVar10 = Instruction::result_id(local_b8);
      _new_id = 0;
      uStack_70 = 0;
      local_68 = 0;
      local_c0 = index;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&new_id,&local_c0,&local_bc);
      object_to_copy_00 =
           InstructionBuilder::AddCompositeExtract
                     (&ir_builder,uVar2,uVar10,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_id);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&new_id);
      uVar2 = GenerateCopy(this,object_to_copy_00,uVar3,local_b0);
      _new_id = CONCAT44(uStack_74,uVar2);
      if (uVar2 == 0) goto LAB_00452645;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&element_ids,(value_type_conflict1 *)&new_id);
    }
  }
  else {
    if (OVar1 != OpTypeArray) {
      return 0;
    }
    uVar10 = 0;
    local_bc = Instruction::GetSingleWordInOperand(pIVar8,0);
    uVar2 = Instruction::GetSingleWordInOperand(this_00,0);
    element_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    element_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    element_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar3 = Instruction::GetSingleWordInOperand(pIVar8,1);
    pCVar9 = analysis::ConstantManager::FindDeclaredConstant(local_58,uVar3);
    iVar4 = (*pCVar9->_vptr_Constant[0xe])(pCVar9);
    if (CONCAT44(extraout_var,iVar4) == 0) {
      __assert_fail("length_const->AsIntConstant()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/pass.cpp"
                    ,0x72,
                    "uint32_t spvtools::opt::Pass::GenerateCopy(Instruction *, uint32_t, Instruction *)"
                   );
    }
    iVar4 = (*pCVar9->_vptr_Constant[0xe])(pCVar9);
    uVar3 = analysis::Constant::GetU32((Constant *)CONCAT44(extraout_var_00,iVar4));
    for (; uVar3 != uVar10; uVar10 = uVar10 + 1) {
      uVar5 = Instruction::result_id(local_b8);
      _new_id = 0;
      uStack_70 = 0;
      local_68 = 0;
      local_c0 = uVar10;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&new_id,&local_c0,&local_bc);
      pIVar8 = InstructionBuilder::AddCompositeExtract
                         (&ir_builder,local_bc,uVar5,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_id);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&new_id);
      uVar5 = GenerateCopy(this,pIVar8,uVar2,local_b0);
      _new_id = CONCAT44(uStack_74,uVar5);
      if (uVar5 == 0) goto LAB_00452645;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&element_ids,(value_type_conflict1 *)&new_id);
    }
  }
  pIVar8 = InstructionBuilder::AddCompositeConstruct(&ir_builder,new_type_id,&element_ids);
  uVar2 = Instruction::result_id(pIVar8);
LAB_00452675:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&element_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return uVar2;
LAB_00452645:
  uVar2 = 0;
  goto LAB_00452675;
}

Assistant:

uint32_t Pass::GenerateCopy(Instruction* object_to_copy, uint32_t new_type_id,
                            Instruction* insertion_position) {
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();

  uint32_t original_type_id = object_to_copy->type_id();
  if (original_type_id == new_type_id) {
    return object_to_copy->result_id();
  }

  InstructionBuilder ir_builder(
      context(), insertion_position,
      IRContext::kAnalysisInstrToBlockMapping | IRContext::kAnalysisDefUse);

  Instruction* original_type = get_def_use_mgr()->GetDef(original_type_id);
  Instruction* new_type = get_def_use_mgr()->GetDef(new_type_id);

  if (new_type->opcode() != original_type->opcode()) {
    return 0;
  }

  switch (original_type->opcode()) {
    case spv::Op::OpTypeArray: {
      uint32_t original_element_type_id =
          original_type->GetSingleWordInOperand(0);
      uint32_t new_element_type_id = new_type->GetSingleWordInOperand(0);

      std::vector<uint32_t> element_ids;
      uint32_t length_id = original_type->GetSingleWordInOperand(1);
      const analysis::Constant* length_const =
          const_mgr->FindDeclaredConstant(length_id);
      assert(length_const->AsIntConstant());
      uint32_t array_length = length_const->AsIntConstant()->GetU32();
      for (uint32_t i = 0; i < array_length; i++) {
        Instruction* extract = ir_builder.AddCompositeExtract(
            original_element_type_id, object_to_copy->result_id(), {i});
        uint32_t new_id =
            GenerateCopy(extract, new_element_type_id, insertion_position);
        if (new_id == 0) {
          return 0;
        }
        element_ids.push_back(new_id);
      }

      return ir_builder.AddCompositeConstruct(new_type_id, element_ids)
          ->result_id();
    }
    case spv::Op::OpTypeStruct: {
      std::vector<uint32_t> element_ids;
      for (uint32_t i = 0; i < original_type->NumInOperands(); i++) {
        uint32_t orig_member_type_id = original_type->GetSingleWordInOperand(i);
        uint32_t new_member_type_id = new_type->GetSingleWordInOperand(i);
        Instruction* extract = ir_builder.AddCompositeExtract(
            orig_member_type_id, object_to_copy->result_id(), {i});
        uint32_t new_id =
            GenerateCopy(extract, new_member_type_id, insertion_position);
        if (new_id == 0) {
          return 0;
        }
        element_ids.push_back(new_id);
      }
      return ir_builder.AddCompositeConstruct(new_type_id, element_ids)
          ->result_id();
    }
    default:
      // If we do not have an aggregate type, then we have a problem.  Either we
      // found multiple instances of the same type, or we are copying to an
      // incompatible type.  Either way the code is illegal. Leave the code as
      // is and let the caller deal with it.
      return 0;
  }
}